

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printMemExtend(MCInst *MI,uint OpNum,SStream *O,char SrcRegKind,uint Width)

{
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  MCOperand *pMVar4;
  int64_t iVar5;
  undefined8 uVar6;
  _Bool IsLSL;
  uint DoShift;
  uint SignExtend;
  uint Width_local;
  char SrcRegKind_local;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  pMVar4 = MCInst_getOperand(MI,OpNum);
  iVar5 = MCOperand_getImm(pMVar4);
  iVar2 = (int)iVar5;
  pMVar4 = MCInst_getOperand(MI,OpNum + 1);
  iVar5 = MCOperand_getImm(pMVar4);
  if (iVar2 == 0 && SrcRegKind == 'x') {
    SStream_concat0(O,"lsl");
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x22;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
  }
  else {
    uVar6 = 0x75;
    if (iVar2 != 0) {
      uVar6 = 0x73;
    }
    SStream_concat(O,"%cxt%c",uVar6,(ulong)(uint)(int)SrcRegKind);
    if (MI->csh->detail != CS_OPT_OFF) {
      if (iVar2 == 0) {
        if (SrcRegKind == 'b') {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2a;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
        else if (SrcRegKind == 'h') {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2a;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
        else if (SrcRegKind == 'w') {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2a;
          puVar1[0] = '\x03';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
      }
      else {
        switch(SrcRegKind) {
        case 'b':
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2a;
          puVar1[0] = '\x05';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          break;
        default:
          break;
        case 'h':
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2a;
          puVar1[0] = '\x06';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          break;
        case 'w':
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2a;
          puVar1[0] = '\a';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          break;
        case 'x':
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2a;
          puVar1[0] = '\b';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
      }
    }
  }
  if (((int)iVar5 != 0) || (iVar2 == 0 && SrcRegKind == 'x')) {
    uVar3 = Log2_32(Width >> 3);
    SStream_concat(O," #%u",(ulong)uVar3);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x22;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar3 = Log2_32(Width >> 3);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x26) = uVar3;
    }
  }
  return;
}

Assistant:

static void printMemExtend(MCInst *MI, unsigned OpNum, SStream *O, char SrcRegKind, unsigned Width)
{
	unsigned SignExtend = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	unsigned DoShift = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum + 1));

	// sxtw, sxtx, uxtw or lsl (== uxtx)
	bool IsLSL = !SignExtend && SrcRegKind == 'x';
	if (IsLSL) {
		SStream_concat0(O, "lsl");
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].shift.type = ARM64_SFT_LSL;
		}
	} else {
		SStream_concat(O, "%cxt%c", (SignExtend ? 's' : 'u'), SrcRegKind);
		if (MI->csh->detail) {
			if (!SignExtend) {
				switch(SrcRegKind) {
					default: break;
					case 'b':
							 MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_UXTB;
							 break;
					case 'h':
							 MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_UXTH;
							 break;
					case 'w':
							 MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_UXTW;
							 break;
				}
			} else {
					switch(SrcRegKind) {
						default: break;
						case 'b':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTB;
							break;
						case 'h':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTH;
							break;
						case 'w':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTW;
							break;
						case 'x':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTX;
							break;
					}
			}
		}
	}

	if (DoShift || IsLSL) {
		SStream_concat(O, " #%u", Log2_32(Width / 8));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].shift.type = ARM64_SFT_LSL;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].shift.value = Log2_32(Width / 8);
		}
	}
}